

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

KeyOriginInfo *
DeserializeKeyOrigin<DataStream>
          (KeyOriginInfo *__return_storage_ptr__,DataStream *s,uint64_t length)

{
  char *pcVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  uint32_t index;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((length == 0) || ((length & 3) != 0)) {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_40 = std::iostream_category();
    index = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar1,(error_code *)"Invalid length for HD key path");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    (__return_storage_ptr__->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Unserialize<DataStream,_unsigned_char,_4>(s,__return_storage_ptr__->fingerprint);
    for (uVar2 = 4; (uVar2 & 0xffffffff) < length; uVar2 = (uVar2 & 0xffffffff) + 4) {
      index = ser_readdata32<DataStream>(s);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&__return_storage_ptr__->path,&index);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

KeyOriginInfo DeserializeKeyOrigin(Stream& s, uint64_t length)
{
    // Read in key path
    if (length % 4 || length == 0) {
        throw std::ios_base::failure("Invalid length for HD key path");
    }

    KeyOriginInfo hd_keypath;
    s >> hd_keypath.fingerprint;
    for (unsigned int i = 4; i < length; i += sizeof(uint32_t)) {
        uint32_t index;
        s >> index;
        hd_keypath.path.push_back(index);
    }
    return hd_keypath;
}